

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

void __thiscall cnn::RmsPropTrainer::update(RmsPropTrainer *this,real scale)

{
  Model *pMVar1;
  pointer ppLVar2;
  long lVar3;
  Parameters *this_00;
  pointer pfVar4;
  LookupParameters *this_01;
  float fVar5;
  int iVar6;
  undefined4 extraout_var;
  pointer ppLVar7;
  ulong uVar8;
  RmsPropTrainer *pRVar9;
  __node_base *p_Var10;
  long lVar11;
  float fVar12;
  RealScalar RVar13;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar14 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  reg;
  float local_174;
  RmsPropTrainer *local_170;
  undefined8 local_168;
  pointer local_160;
  pointer local_158;
  real *local_150;
  pointer local_148;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> local_140 [24];
  StorageBaseType local_128 [24];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_110;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_e0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
  local_a8;
  
  local_170 = this;
  if (this->shadow_params_allocated == false) {
    pMVar1 = (this->super_Trainer).model;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->hg,
               (long)(pMVar1->params).
                     super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pMVar1->params).
                     super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
    pMVar1 = (this->super_Trainer).model;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&this->hlg,
             (long)(pMVar1->lookup_params).
                   super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pMVar1->lookup_params).
                   super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
    pMVar1 = (this->super_Trainer).model;
    uVar8 = 0;
    ppLVar2 = (pMVar1->lookup_params).
              super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppLVar7 = (pMVar1->lookup_params).
                   super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppLVar7 != ppLVar2;
        ppLVar7 = ppLVar7 + 1) {
      lVar11 = uVar8 * 0x18;
      lVar3 = *(long *)&this->hlg;
      uVar8 = (ulong)((int)uVar8 + 1);
      iVar6 = (*((*ppLVar7)->super_ParametersBase)._vptr_ParametersBase[3])();
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)(lVar11 + lVar3),
                 CONCAT44(extraout_var,iVar6));
    }
    local_170->shadow_params_allocated = true;
  }
  pRVar9 = local_170;
  fVar12 = Trainer::clip_gradients(&local_170->super_Trainer);
  pMVar1 = (pRVar9->super_Trainer).model;
  local_150 = &(pRVar9->super_Trainer).lambda;
  local_168 = (long *)((ulong)local_168._4_4_ << 0x20);
  local_160 = (pMVar1->params).
              super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  for (local_158 = (pMVar1->params).
                   super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
                   .super__Vector_impl_data._M_start; local_158 != local_160;
      local_158 = local_158 + 1) {
    this_00 = *local_158;
    pfVar4 = (local_170->hg).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (ulong)local_168 & 0xffffffff;
    local_168 = (long *)CONCAT44(local_168._4_4_,(int)local_168 + 1);
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_a8,
                &this_00->values);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator*
              (&local_110,
               (MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
               &local_a8,local_150);
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_a8,
                &this_00->g);
    RVar13 = Eigen::
             MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
             ::squaredNorm((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                            *)&local_a8);
    pRVar9 = local_170;
    auVar18._0_8_ = (double)(local_170->rho * pfVar4[uVar8]);
    auVar18._8_8_ = 0;
    auVar14._0_8_ = (double)RVar13;
    auVar14._8_8_ = extraout_XMM0_Qb;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = 1.0 - (double)local_170->rho;
    auVar15 = vfmadd213sd_fma(auVar14,auVar16,auVar18);
    pfVar4[uVar8] = (float)auVar15._0_8_;
    fVar5 = (float)auVar15._0_8_ + local_170->epsilon;
    auVar15 = vrsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
    auVar17 = vfmadd213ss_fma(ZEXT416((uint)(fVar5 * auVar15._0_4_)),auVar15,ZEXT416(0xc0400000));
    local_174 = fVar12 * scale * (local_170->super_Trainer).eta * auVar15._0_4_ * -0.5 *
                auVar17._0_4_;
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_128,
                &this_00->g);
    Eigen::operator*(&local_e0,&local_174,local_128);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
    ::operator+(&local_a8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                 *)&local_e0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                 *)&local_110);
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_140,
                &this_00->values);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator-=
              (local_140,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
                *)&local_a8);
    Parameters::clear(this_00);
  }
  pMVar1 = (pRVar9->super_Trainer).model;
  uVar8 = 0;
  local_148 = (pMVar1->lookup_params).
              super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  for (local_158 = (pointer)(pMVar1->lookup_params).
                            super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
      local_158 != (pointer)local_148; local_158 = local_158 + 1) {
    this_01 = (LookupParameters *)*local_158;
    local_168 = (long *)(uVar8 * 0x18 + *(long *)&pRVar9->hlg);
    local_160 = (pointer)CONCAT44(local_160._4_4_,(int)uVar8);
    p_Var10 = &(this_01->non_zero_grads)._M_h._M_before_begin;
    while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
      uVar8 = (ulong)(uint)*(size_type *)(p_Var10 + 1);
      lVar3 = *local_168;
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_a8,
                  (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar8);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator*(&local_110,
                (MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
                &local_a8,local_150);
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_a8,
                  (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar8);
      RVar13 = Eigen::
               MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
               ::squaredNorm((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                              *)&local_a8);
      auVar19._0_8_ = (double)(local_170->rho * *(float *)(lVar3 + uVar8 * 4));
      auVar19._8_8_ = 0;
      auVar15._0_8_ = (double)RVar13;
      auVar15._8_8_ = extraout_XMM0_Qb_00;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = 1.0 - (double)local_170->rho;
      auVar15 = vfmadd213sd_fma(auVar15,auVar17,auVar19);
      *(float *)(lVar3 + uVar8 * 4) = (float)auVar15._0_8_;
      fVar5 = (float)auVar15._0_8_ + local_170->epsilon;
      auVar15 = vrsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
      auVar17 = vfmadd213ss_fma(ZEXT416((uint)(fVar5 * auVar15._0_4_)),auVar15,ZEXT416(0xc0400000));
      local_174 = fVar12 * scale * (local_170->super_Trainer).eta * auVar15._0_4_ * -0.5 *
                  auVar17._0_4_;
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_128,
                  (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar8);
      Eigen::operator*(&local_e0,&local_174,local_128);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
      ::operator+(&local_a8,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                   *)&local_e0,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                   *)&local_110);
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_140,
                  (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar8);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator-=(local_140,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
                  *)&local_a8);
    }
    uVar8 = (ulong)((int)local_160 + 1);
    LookupParameters::clear(this_01);
    pRVar9 = local_170;
  }
  (pRVar9->super_Trainer).updates = (pRVar9->super_Trainer).updates + 1.0;
  return;
}

Assistant:

void RmsPropTrainer::update(real scale) {
  unsigned pi = 0;
  if (!shadow_params_allocated) {
    hg.resize(model->parameters_list().size());

    pi = 0;
    hlg.resize(model->lookup_parameters_list().size());
    for (auto p : model->lookup_parameters_list()) {
      hlg[pi++].resize(p->size());
    }

    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  for (auto p : model->parameters_list()) {
    real& d2 = hg[pi++];
    auto reg = p->values.vec() * lambda;
    real g2 = p->g.vec().squaredNorm();
    d2 = rho * d2 + (1.0 - rho) * g2;
    p->values.vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->g.vec() + reg);
    p->clear();
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<real>& hlgx = hlg[pi++];
    for (auto i : p->non_zero_grads) {
      real& d2 = hlgx[i];
      auto reg = p->values[i].vec() * lambda;
      real g2 = p->grads[i].vec().squaredNorm();
      d2 = rho * d2 + (1.0 - rho) * g2;
      p->values[i].vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->grads[i].vec() + reg);
    }
    p->clear();
  }
  ++updates;
}